

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O0

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmTextureCalc::Get3DMipByteAddress
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  ulong uVar1;
  uint local_80;
  uint local_7c;
  uint32_t local_70;
  uint local_6c;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  GMM_RESOURCE_FORMAT GenericFormat;
  uint uStack_58;
  uint8_t Compress;
  uint32_t Pitch;
  uint32_t MipLevel;
  uint32_t Slice;
  GMM_GFX_SIZE_T ExtraBytes;
  GMM_GFX_SIZE_T MipMapByteAddress;
  uint32_t UnitAlignWidth;
  uint32_t UnitAlignHeight;
  uint32_t MipWidth;
  uint32_t MipHeight;
  uint32_t PlaneRows;
  uint32_t MipsInThisRow;
  GMM_REQ_OFFSET_INFO *pReqInfo_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  if (this->pGmmLibContext == (Context *)0x0) {
    this_local = (GmmTextureCalc *)0x0;
  }
  else {
    CompressWidth = pTexInfo->Format;
    Pitch = pReqInfo->Slice;
    uStack_58 = pReqInfo->MipLevel;
    GenericFormat = (GMM_RESOURCE_FORMAT)pTexInfo->Pitch;
    if (Pitch == 0) {
      ExtraBytes = *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + (ulong)uStack_58 * 8 + 0x78);
    }
    else {
      ExtraBytes = *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + (ulong)uStack_58 * 8 + 0x78);
      _PlaneRows = pReqInfo;
      pReqInfo_local = (GMM_REQ_OFFSET_INFO *)pTexInfo;
      pTexInfo_local = (GMM_TEXTURE_INFO *)this;
      MipHeight = GFX_2_TO_POWER_OF(uStack_58);
      MipWidth = Pitch / MipHeight;
      UnitAlignWidth = (pReqInfo_local->Lock).field_0.Offset >> ((byte)uStack_58 & 0x1f);
      UnitAlignHeight = (pReqInfo_local->Lock).Pitch >> ((byte)uStack_58 & 0x1f);
      MipMapByteAddress._0_4_ = (uint)(pReqInfo_local->StdLayout).TileRowPitch;
      MipMapByteAddress._4_4_ = *(uint *)((long)&(pReqInfo_local->StdLayout).TileRowPitch + 4);
      CompressHeight._3_1_ = GmmIsCompressed(this->pGmmLibContext,pReqInfo_local->ArrayIndex);
      GetCompressionBlockDimensions
                (this,pReqInfo_local->ArrayIndex,&local_6c,&CompressDepth,&local_70);
      if (MipMapByteAddress._4_4_ < UnitAlignHeight) {
        local_7c = UnitAlignHeight;
      }
      else {
        local_7c = MipMapByteAddress._4_4_;
      }
      UnitAlignHeight =
           (local_7c + (MipMapByteAddress._4_4_ - 1)) -
           (local_7c + (MipMapByteAddress._4_4_ - 1) & MipMapByteAddress._4_4_ - 1);
      if ((uint)MipMapByteAddress < UnitAlignWidth) {
        local_80 = UnitAlignWidth;
      }
      else {
        local_80 = (uint)MipMapByteAddress;
      }
      UnitAlignWidth =
           (local_80 + ((uint)MipMapByteAddress - 1)) -
           (local_80 + ((uint)MipMapByteAddress - 1) & (uint)MipMapByteAddress - 1);
      if (CompressHeight._3_1_ == '\0') {
        uVar1._0_4_ = pReqInfo_local->Slice;
        uVar1._4_4_ = pReqInfo_local->CubeFace;
        if ((uVar1 >> 0x1d & 1) != 0) {
          UnitAlignWidth = UnitAlignWidth * 2;
          UnitAlignHeight = UnitAlignHeight >> 1;
        }
      }
      else {
        UnitAlignWidth = UnitAlignWidth / local_6c;
        UnitAlignHeight = UnitAlignHeight / CompressDepth;
      }
      ExtraBytes = (((ulong)Pitch % (ulong)MipHeight) * (ulong)UnitAlignWidth *
                    (ulong)pReqInfo_local->MipLevel >> 3) +
                   (ulong)MipWidth * (ulong)UnitAlignHeight * (ulong)GenericFormat + ExtraBytes;
    }
    this_local = (GmmTextureCalc *)ExtraBytes;
  }
  return (GMM_GFX_SIZE_T)this_local;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmTextureCalc::Get3DMipByteAddress(GMM_TEXTURE_INFO *   pTexInfo,
                                                           GMM_REQ_OFFSET_INFO *pReqInfo)
{
    uint32_t            MipsInThisRow, PlaneRows;
    uint32_t            MipHeight, MipWidth;
    uint32_t            UnitAlignHeight, UnitAlignWidth;
    GMM_GFX_SIZE_T      MipMapByteAddress, ExtraBytes;
    uint32_t            Slice, MipLevel, Pitch;
    uint8_t             Compress;
    GMM_RESOURCE_FORMAT GenericFormat;
    uint32_t            CompressHeight, CompressWidth, CompressDepth;

    __GMM_ASSERTPTR(pGmmLibContext, 0);

    GenericFormat = pTexInfo->Format;
    Slice         = pReqInfo->Slice;
    MipLevel      = pReqInfo->MipLevel;
    Pitch         = GFX_ULONG_CAST(pTexInfo->Pitch);

    // For slice 0 for any mip address is simple and stored in table
    if(Slice == 0)
    {
        MipMapByteAddress = pTexInfo->OffsetInfo.Texture3DOffsetInfo.Offset[MipLevel];
    }
    // For any slice
    else
    {
        MipMapByteAddress = pTexInfo->OffsetInfo.Texture3DOffsetInfo.Offset[MipLevel];

        // See how many mip can fit in one row
        MipsInThisRow = GFX_2_TO_POWER_OF(MipLevel);

        PlaneRows = Slice / MipsInThisRow;

        // make sure we get the height and mip of base level
        MipWidth  = GFX_ULONG_CAST(pTexInfo->BaseWidth);
        MipHeight = pTexInfo->BaseHeight;

        MipWidth >>= MipLevel;
        MipHeight >>= MipLevel;

        UnitAlignWidth  = pTexInfo->Alignment.HAlign;
        UnitAlignHeight = pTexInfo->Alignment.VAlign;
        Compress        = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
        GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

        // clamp such that mip height is at least min height
        MipHeight = GFX_MAX(MipHeight, UnitAlignHeight);
        MipHeight = GFX_ALIGN(MipHeight, UnitAlignHeight);

        // clamp such that mip width is at least min width
        MipWidth = GFX_MAX(MipWidth, UnitAlignWidth);
        MipWidth = GFX_ALIGN(MipWidth, UnitAlignWidth);

        if(Compress)
        {
            MipWidth /= CompressWidth;
            MipHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            MipWidth *= 2;
            MipHeight /= 2;
        }

        ExtraBytes = (GMM_GFX_SIZE_T)PlaneRows * MipHeight * Pitch;

        ExtraBytes += ((GMM_GFX_SIZE_T)(Slice % MipsInThisRow) *
                       MipWidth * pTexInfo->BitsPerPixel) >>
                      3;

        // get address offset
        MipMapByteAddress += ExtraBytes;
    }

    return MipMapByteAddress;
}